

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linkpool_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  int_linklist *link;
  int_linklist *link_00;
  int_linklist *link_01;
  testfunc_linklist *ptVar12;
  testfunc_linklist *f1;
  testfunc_linklist *f0;
  int_linklist *i2;
  int_linklist *i1;
  int_linklist *i0;
  _Bool passed;
  char **argv_local;
  int argc_local;
  
  _Var3 = int_linkpool_init();
  _Var4 = int_linkpool_is_thrd_init();
  _Var5 = int_linkpool_thrd_init();
  _Var6 = int_linkpool_is_thrd_init();
  _Var7 = int_linkpool_is_empty();
  link = int_linkpool_rent();
  link_00 = int_linkpool_rent();
  link_01 = int_linkpool_rent();
  _Var8 = int_linkpool_is_empty();
  link->item = 0x3039;
  iVar1 = link->item;
  _Var9 = testfunc_linkpool_init();
  _Var10 = testfunc_linkpool_thrd_init();
  ptVar12 = testfunc_linkpool_rent();
  testfunc_linkpool_rent();
  testfunc_linkpool_return(ptVar12);
  ptVar12 = testfunc_linkpool_rent();
  ptVar12->item = testfunc_increment;
  (*ptVar12->item)(&link->item);
  iVar2 = link->item;
  int_linkpool_return(link);
  int_linkpool_return(link_00);
  int_linkpool_return(link_01);
  _Var11 = int_linkpool_is_empty();
  int_linkpool_thrd_quit();
  testfunc_linkpool_thrd_quit();
  return (uint)(((((((((((_Var3 & (_Var4 ^ 0xffU) & 1) != 0 && _Var5) && _Var6) && _Var7) &
                     (_Var8 ^ 0xffU) & 1) != 0 && iVar1 == 0x3039) && _Var9) && _Var10) &&
                 iVar2 == 0x303a) & (_Var11 ^ 0xffU) & 1) == 0);
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    passed &= int_linkpool_init();
    passed &= !int_linkpool_is_thrd_init();
    passed &= int_linkpool_thrd_init();
    passed &= int_linkpool_is_thrd_init();
    passed &= int_linkpool_is_empty();

    int_linklist *i0 = int_linkpool_rent();
    int_linklist *i1 = int_linkpool_rent();
    int_linklist *i2 = int_linkpool_rent();

    passed &= !int_linkpool_is_empty();

    i0->item = 12345;
    passed &= i0->item == 12345;

    passed &= testfunc_linkpool_init();
    passed &= testfunc_linkpool_thrd_init();

    testfunc_linklist *f0 = testfunc_linkpool_rent();
    testfunc_linklist *f1 = testfunc_linkpool_rent();
    testfunc_linkpool_return(f0);
    f0 = testfunc_linkpool_rent();

    f0->item = testfunc_increment;

    f0->item(&i0->item);

    passed &= i0->item == 12346;

    int_linkpool_return(i0);
    int_linkpool_return(i1);
    int_linkpool_return(i2);

    passed &= !int_linkpool_is_empty();

    int_linkpool_thrd_quit();
    testfunc_linkpool_thrd_quit();

    return passed ? 0 : 1;
}